

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bucket.h
# Opt level: O0

bool __thiscall Bucket<int>::readAndRemove(Bucket<int> *this,int pos)

{
  bool bVar1;
  reference piVar2;
  int in_ESI;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_RDI;
  int *v;
  iterator __end0;
  iterator __begin0;
  vector<int,_std::allocator<int>_> *__range2;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffb8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_28 [2];
  int local_14;
  
  if (*(int *)&in_RDI[3]._M_current != 0) {
    local_14 = in_ESI;
    local_28[0]._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffffb8);
    std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffffb8);
    while (bVar1 = __gnu_cxx::operator!=
                             (in_RDI,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                      *)in_stack_ffffffffffffffb8), bVar1) {
      piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(local_28);
      if (*piVar2 == local_14) {
        *piVar2 = -1;
        *(int *)&in_RDI[3]._M_current = *(int *)&in_RDI[3]._M_current + -1;
        return true;
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (local_28);
    }
  }
  return false;
}

Assistant:

bool readAndRemove(label_t pos)
      {
         if(bsize == 0)
            return false;
         for(auto &v : blocks)
         {
            if(v == pos)
            {
               v = -1;
               --bsize;
               return true;
            }
         }
         return false;
      }